

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

int Aig_BaseSize(Aig_Man_t *p,Aig_Obj_t *pObj,int nLutSize)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int nBaseSize;
  int nLutSize_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  pObj_00 = Aig_Regular(pObj);
  iVar1 = Aig_ObjIsConst1(pObj_00);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjLevel(pObj_00);
    if (iVar1 < nLutSize) {
      p_local._4_4_ = Aig_SupportSize(p,pObj_00);
      if (nLutSize <= p_local._4_4_) {
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Aig_BaseSize( Aig_Man_t * p, Aig_Obj_t * pObj, int nLutSize )
{
    int nBaseSize;
    pObj = Aig_Regular(pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return 0;
    if ( Aig_ObjLevel(pObj) >= nLutSize )
        return 1;
    nBaseSize = Aig_SupportSize( p, pObj );
    if ( nBaseSize >= nLutSize )
        return 1;
    return nBaseSize;
}